

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

bool __thiscall Functor::operator==(Functor *this,Functor *other)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (this->id)._M_string_length;
  if (__n == (other->id)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->id)._M_dataplus._M_p,(other->id)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(this->arity == other->arity & bVar2);
}

Assistant:

bool operator==(const Functor &other) const {
        return id == other.id && arity == other.arity;
    }